

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void string_contains_stl_string_pointer(void)

{
  string *psVar1;
  char *in_stack_ffffffffffffffc8;
  string *this;
  int line;
  allocator *file;
  allocator local_1;
  
  psVar1 = (string *)operator_new(0x20);
  file = &local_1;
  this = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"obbo",file);
  bob_pointer_abi_cxx11_ = psVar1;
  line = (int)((ulong)this >> 0x20);
  psVar1 = bob_pointer_abi_cxx11_;
  std::allocator<char>::~allocator((allocator<char> *)&local_1);
  cgreen::create_contains_string_constraint((string *)bob_pointer_abi_cxx11_,"bob_pointer");
  cgreen::assert_that_<char_const*>
            ((char *)file,line,(char *)psVar1,in_stack_ffffffffffffffc8,(Constraint *)0x11a5d4);
  return;
}

Assistant:

Ensure(string_contains_stl_string_pointer) {
    bob_pointer = new std::string("obbo");
    assert_that("bobbob", contains_string(bob_pointer));
}